

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_1::OptionsToInterpret::OptionsToInterpret
          (OptionsToInterpret *this,string *ns,string *el,vector<int,_std::allocator<int>_> *path,
          Message *orig_opt,Message *opt)

{
  string *in_RDX;
  string *in_RSI;
  string *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  vector<int,_std::allocator<int>_> *unaff_retaddr;
  string *__x;
  
  __x = in_RDI;
  std::__cxx11::string::string(in_RDI,in_RSI);
  std::__cxx11::string::string(in_RDI + 0x20,in_RDX);
  std::vector<int,_std::allocator<int>_>::vector
            (unaff_retaddr,(vector<int,_std::allocator<int>_> *)__x);
  *(undefined8 *)(in_RDI + 0x58) = in_R8;
  *(undefined8 *)(in_RDI + 0x60) = in_R9;
  return;
}

Assistant:

OptionsToInterpret(const std::string& ns, const std::string& el,
                     const std::vector<int>& path, const Message* orig_opt,
                     Message* opt)
      : name_scope(ns),
        element_name(el),
        element_path(path),
        original_options(orig_opt),
        options(opt) {}